

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall
kj::HttpServer::Connection::accept(Connection *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *pMVar1;
  uint uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
  node;
  PromiseFulfiller<void> *pPVar3;
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  undefined8 node_00;
  Disposer DVar4;
  char *pcVar5;
  size_t sVar6;
  OwnPromiseNode node_01;
  Disposer *pDVar7;
  PromiseFulfiller<void> *pPVar8;
  HttpHeaders *in_R8;
  PromiseNode *ptrCopy;
  ArrayPtr<const_char> word1;
  ArrayPtr<const_char> word2;
  Fault f;
  DebugExpression<bool> _kjCondition;
  undefined1 local_98 [16];
  OwnPromiseNode local_88;
  undefined8 local_80;
  Disposer local_78;
  size_t sStack_70;
  String local_68;
  OwnPromiseNode local_48;
  size_t sStack_40;
  anon_class_8_1_a7efefcd_for_func local_38;
  
  if ((this->currentMethod).ptr.isSet == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)(local_98 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9a,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)(local_98 + 8));
  }
  uVar2 = (this->currentMethod).ptr.field_1.value.tag;
  (this->currentMethod).ptr.isSet = false;
  if (uVar2 == 1) {
    (this->currentMethod).ptr.field_1.value.tag = 0;
  }
  if ((this->currentMethod).ptr.field_1.value.tag == 2) {
    (this->currentMethod).ptr.field_1.value.tag = 0;
  }
  local_78._vptr_Disposer._0_1_ = uVar2 == 2;
  if (uVar2 != 2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
              ((Fault *)(local_98 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9c,FAILED,"method.is<HttpConnectMethod>()",
               "_kjCondition,\"only use accept() with CONNECT requests\"",
               (DebugExpression<bool> *)&local_78,
               (char (*) [40])"only use accept() with CONNECT requests");
    kj::_::Debug::Fault::fatal((Fault *)(local_98 + 8));
  }
  local_78._vptr_Disposer._0_1_ = __fd - 200U < 100;
  if (!local_78._vptr_Disposer._0_1_) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[38]>
              ((Fault *)(local_98 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9d,FAILED,"statusCode >= 200 && statusCode < 300",
               "_kjCondition,\"the statusCode must be 2xx for accept\"",(bool *)&local_78,
               (char (*) [38])"the statusCode must be 2xx for accept");
    kj::_::Debug::Fault::fatal((Fault *)(local_98 + 8));
  }
  if ((this->tunnelRejected).ptr.isSet == true) {
    (this->tunnelRejected).ptr.isSet = false;
    node = (this->tunnelRejected).ptr.field_1;
    if (node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
                 )0x0) {
      (this->tunnelRejected).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
            )0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  pMVar1 = &this->tunnelWriteGuard;
  if ((this->tunnelWriteGuard).ptr.ptr != (PromiseFulfiller<void> *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    sStack_40 = 0;
    kj::_::Stringifier::operator*
              ((CappedArray<char,_14UL> *)(local_98 + 8),(Stringifier *)&kj::_::STR,__fd);
    sStack_70 = (long)__addr_len - 1;
    word3.size_ = sStack_70;
    word3.ptr = (char *)__addr;
    connectionHeaders.size_ = sStack_40;
    connectionHeaders.ptr = (StringPtr *)local_48.ptr;
    word1.size_ = 8;
    word1.ptr = "HTTP/1.1";
    word2.size_ = local_98._8_8_;
    word2.ptr = (char *)&local_88;
    local_78._vptr_Disposer = (_func_int **)__addr;
    HttpHeaders::serialize(&local_68,in_R8,word1,word2,word3,connectionHeaders);
    anon_unknown_36::HttpOutputStream::writeHeaders(&this->httpOutput,&local_68);
    sVar6 = local_68.content.size_;
    pcVar5 = local_68.content.ptr;
    if (local_68.content.ptr != (char *)0x0) {
      local_68.content.ptr = (char *)0x0;
      local_68.content.size_ = 0;
      (**(local_68.content.disposer)->_vptr_ArrayDisposer)
                (local_68.content.disposer,pcVar5,1,sVar6,sVar6,0);
    }
    anon_unknown_36::HttpOutputStream::flush((HttpOutputStream *)local_98);
    local_98._8_8_ =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:8098:44)>
         ::anon_class_8_1_a7efefcd_for_func::operator();
    local_38.fulfiller = &pMVar1->ptr;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::SimpleTransformPromiseNode<void,kj::HttpServer::Connection::accept(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>,kj::_::PromiseDisposer,kj::HttpServer::Connection::accept(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_,void*&>
              ((PromiseDisposer *)&local_78,(OwnPromiseNode *)local_98,&local_38,
               (void **)(local_98 + 8));
    local_48.ptr = (PromiseNode *)local_78._vptr_Disposer;
    local_98._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    local_88.ptr = (PromiseNode *)0x5b1ef0;
    local_80._0_1_ = true;
    local_80._1_1_ = true;
    local_80._2_1_ = false;
    local_80._3_5_ = 0x1400;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_78,&local_48,(SourceLocation *)(local_98 + 8));
    node_01.ptr = local_48.ptr;
    DVar4._vptr_Disposer = local_78._vptr_Disposer;
    if (&(local_48.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node_01.ptr)->super_PromiseArenaMember);
    }
    node_00 = local_98._0_8_;
    if ((Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)local_98._0_8_ !=
        (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0) {
      local_98._0_8_ = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
    }
    pPVar3 = (this->tunnelWriteGuard).ptr.ptr;
    pDVar7 = (Disposer *)operator_new(0x20);
    pDVar7->_vptr_Disposer = (_func_int **)&PTR___cxa_pure_virtual_006e1418;
    pDVar7[1]._vptr_Disposer = DVar4._vptr_Disposer;
    pDVar7[2]._vptr_Disposer = (_func_int **)(pMVar1->ptr).disposer;
    pDVar7[3]._vptr_Disposer = (_func_int **)pPVar3;
    (this->tunnelWriteGuard).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar7->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_00706b10;
    pPVar8 = (PromiseFulfiller<void> *)0x1;
    if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
      pPVar8 = pPVar3;
    }
    (pMVar1->ptr).disposer = pDVar7;
    (this->tunnelWriteGuard).ptr.ptr = pPVar8;
    return (int)pDVar7;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
            ((Fault *)(local_98 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fa0,FAILED,"tunnelWriteGuard != nullptr",
             "\"the tunnel stream was not initialized\"",
             (char (*) [38])"the tunnel stream was not initialized");
  kj::_::Debug::Fault::fatal((Fault *)(local_98 + 8));
}

Assistant:

void accept(uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;
    KJ_ASSERT(method.is<HttpConnectMethod>(), "only use accept() with CONNECT requests");
    KJ_REQUIRE(statusCode >= 200 && statusCode < 300, "the statusCode must be 2xx for accept");
    tunnelRejected = kj::none;

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    httpOutput.writeHeaders(headers.serializeResponse(statusCode, statusText));
    auto promise = httpOutput.flush().then([&fulfiller]() {
      fulfiller->fulfill();
    }).eagerlyEvaluate(nullptr);
    fulfiller = fulfiller.attach(kj::mv(promise));
  }